

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage1Runner.hpp
# Opt level: O3

void __thiscall
Centaurus::Stage1Runner::Stage1Runner
          (Stage1Runner *this,char *filename,IParser *parser,size_t bank_size,int bank_num,
          bool is_dry,bool is_result_captured)

{
  __pid_t pid;
  sem_t *psVar1;
  
  pid = getpid();
  BaseRunner::BaseRunner(&this->super_BaseRunner,filename,bank_size,bank_num,pid);
  (this->super_BaseRunner).super_BaseListener._vptr_BaseListener =
       (_func_int **)&PTR__Stage1Runner_0019d318;
  this->m_parser = parser;
  this->is_dry = is_dry;
  this->is_result_captured = is_result_captured;
  (this->result_chunks_).
  super__Vector_base<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->result_chunks_).
  super__Vector_base<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->result_chunks_).
  super__Vector_base<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>,_std::allocator<Centaurus::detail::ConstPtrRange<Centaurus::CSTMarker>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BaseRunner::acquire_memory(&this->super_BaseRunner,true);
  psVar1 = sem_open((this->super_BaseRunner).m_slave_lock_name,0xc0,0x180,0);
  (this->super_BaseRunner).m_slave_lock = (sem_t *)psVar1;
  return;
}

Assistant:

Stage1Runner(const char *filename, IParser *parser, size_t bank_size, int bank_num, bool is_dry=false, bool is_result_captured=false)
    : BaseRunner(filename, bank_size, bank_num), m_parser(parser), is_dry(is_dry), is_result_captured(is_result_captured)
  {
    acquire_memory(true);
    create_semaphore();
  }